

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlskey_openssl.cpp
# Opt level: O2

void __thiscall
QTlsPrivate::TlsKeyOpenSSL::decodeDer
          (TlsKeyOpenSSL *this,KeyType type,KeyAlgorithm algorithm,QByteArray *der,
          QByteArray *passPhrase,bool deepClear)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  QMap<QByteArray,_QByteArray> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((der->d).size != 0) {
    (this->super_TlsKeyBase).keyType = type;
    (this->super_TlsKeyBase).keyAlgorithm = algorithm;
    local_40.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_*>
            )0x0;
    local_58.size = -0x5555555555555556;
    local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    TlsKeyBase::pemFromDer((QByteArray *)&local_58,&this->super_TlsKeyBase,der,&local_40);
    decodePem(this,type,algorithm,(QByteArray *)&local_58,passPhrase,deepClear);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_40.d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TlsKeyOpenSSL::decodeDer(QSsl::KeyType type, QSsl::KeyAlgorithm algorithm, const QByteArray &der,
                              const QByteArray &passPhrase, bool deepClear)
{
    if (der.isEmpty())
        return;

    keyType = type;
    keyAlgorithm = algorithm;

    QMap<QByteArray, QByteArray> headers;
    const auto pem = pemFromDer(der, headers);

    decodePem(type, algorithm, pem, passPhrase, deepClear);
}